

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

void __thiscall RString::Capitalize(RString *this)

{
  char cVar1;
  byte *pbVar2;
  byte bVar3;
  long lVar4;
  
  if ((this->myString != (char *)0x0) && ('\0' < this->myString[-1])) {
    CloneString(this);
  }
  cVar1 = *this->myString;
  if ((byte)(cVar1 + 0x9fU) < 0x1a) {
    *this->myString = cVar1 + -0x20;
  }
  bVar3 = this->myString[1];
  if (bVar3 != 0) {
    pbVar2 = (byte *)(this->myString + 1);
    lVar4 = 2;
    do {
      if ((byte)(bVar3 + 0xbf) < 0x1a) {
        *pbVar2 = bVar3 | 0x20;
      }
      bVar3 = this->myString[lVar4];
      pbVar2 = (byte *)(this->myString + lVar4);
      lVar4 = lVar4 + 1;
    } while (bVar3 != 0);
  }
  return;
}

Assistant:

void RString::Capitalize(void)
{
	PrepForMod();
	if(*myString >= 'a' && *myString <= 'z')
		*myString += 'A' - 'a';
	for(int i = 1; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'A' && *(myString + i) <= 'Z')
			*(myString + i) += 'a' - 'A';
}